

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cc
# Opt level: O2

void __thiscall
absl::lts_20240722::flags_internal::anon_unknown_6::RetiredFlagObj::OnAccess(RetiredFlagObj *this)

{
  undefined1 local_c8 [80];
  AlphaNum local_78;
  AlphaNum local_48;
  
  local_48.piece_ = NullSafeStringView("Accessing retired flag \'");
  local_78.piece_ = NullSafeStringView(this->name_);
  local_c8._32_16_ = (undefined1  [16])NullSafeStringView("\'");
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_c8,&local_48,&local_78);
  absl::lts_20240722::flags_internal::ReportUsageError(local_c8._8_8_,local_c8._0_8_,0);
  std::__cxx11::string::~string((string *)local_c8);
  return;
}

Assistant:

void OnAccess() const {
    flags_internal::ReportUsageError(
        absl::StrCat("Accessing retired flag '", name_, "'"), false);
  }